

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O1

void __thiscall
rsg::ValueRange::ValueRange
          (ValueRange *this,VariableType *type,ConstValueAccess *minVal,ConstValueAccess *maxVal)

{
  Scalar *pSVar1;
  pointer pSVar2;
  int iVar3;
  pointer pSVar4;
  allocator_type local_32;
  allocator_type local_31;
  
  VariableType::VariableType(&this->m_type,type);
  iVar3 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar3,&local_31)
  ;
  iVar3 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar3,&local_32)
  ;
  pSVar1 = minVal->m_value;
  pSVar2 = (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar4 = (pointer)0x0;
  if (pSVar2 != (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar4 = pSVar2;
  }
  iVar3 = VariableType::getScalarSize(&this->m_type);
  if (iVar3 != 0) {
    memmove(pSVar4,pSVar1,(long)iVar3 << 2);
  }
  pSVar1 = maxVal->m_value;
  pSVar2 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar4 = (pointer)0x0;
  if (pSVar2 != (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar4 = pSVar2;
  }
  iVar3 = VariableType::getScalarSize(&this->m_type);
  if (iVar3 != 0) {
    memmove(pSVar4,pSVar1,(long)iVar3 << 2);
  }
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type, const ConstValueAccess& minVal, const ConstValueAccess& maxVal)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
	getMin() = minVal.value();
	getMax() = maxVal.value();
}